

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void bestVirtualIndex(WhereBestIdx *p)

{
  Bitmask *pBVar1;
  byte *pbVar2;
  ushort uVar3;
  Parse *pParse;
  WhereClause *pWVar4;
  SrcList_item *pSVar5;
  Table *pTab;
  ExprList *pEVar6;
  ExprList_item *pEVar7;
  sqlite3_index_constraint_usage *__s;
  sqlite3_vtab *psVar8;
  WhereTerm *pWVar9;
  uint uVar10;
  u16 *puVar11;
  sqlite3_index_info *psVar12;
  VTable *pVVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  sqlite3_index_constraint *psVar18;
  int *piVar19;
  long lVar20;
  uchar *puVar21;
  uchar uVar22;
  uint uVar23;
  int iVar24;
  char cVar25;
  int iVar26;
  long lVar27;
  bool bVar28;
  double dVar29;
  double N;
  int local_50;
  
  pParse = p->pParse;
  pWVar4 = p->pWC;
  pSVar5 = p->pSrc;
  pTab = pSVar5->pTab;
  (p->cost).plan.wsFlags = 0;
  (p->cost).plan.nEq = 0;
  (p->cost).plan.nOBSat = 0;
  (p->cost).plan.nRow = 0.0;
  (p->cost).plan.u.pIdx = (Index *)0x0;
  (p->cost).rCost = 0.0;
  (p->cost).used = 0;
  (p->cost).plan.wsFlags = 0x8000000;
  psVar12 = *p->ppIdxInfo;
  if (psVar12 == (sqlite3_index_info *)0x0) {
    pEVar6 = p->pOrderBy;
    iVar26 = 0;
    iVar15 = pWVar4->nTerm;
    if (pWVar4->nTerm < 1) {
      iVar15 = iVar26;
    }
    puVar11 = &pWVar4->a->eOperator;
    while (bVar28 = iVar15 != 0, iVar15 = iVar15 + -1, bVar28) {
      if (*(int *)(puVar11 + -6) == pSVar5->iCursor) {
        iVar26 = iVar26 + (uint)((*puVar11 & 0x80) == 0);
      }
      puVar11 = puVar11 + 0x1c;
    }
    if (pEVar6 == (ExprList *)0x0) {
      uVar23 = 0;
    }
    else {
      uVar10 = pEVar6->nExpr;
      lVar20 = 0;
      uVar16 = 0;
      if (0 < (int)uVar10) {
        uVar16 = (ulong)uVar10;
      }
      uVar23 = 0;
      for (; uVar16 << 5 != lVar20; lVar20 = lVar20 + 0x20) {
        pcVar14 = *(char **)((long)&pEVar6->a->pExpr + lVar20);
        if ((*pcVar14 != -0x68) || (*(int *)(pcVar14 + 0x2c) != pSVar5->iCursor)) {
          uVar16 = (ulong)uVar23;
          break;
        }
        uVar23 = uVar23 + 1;
      }
      uVar23 = 0;
      if ((uint)uVar16 == uVar10) {
        uVar23 = uVar10;
      }
    }
    psVar12 = (sqlite3_index_info *)
              sqlite3DbMallocZero(pParse->db,iVar26 * 0x14 + uVar23 * 8 + 0x48);
    if (psVar12 == (sqlite3_index_info *)0x0) {
      sqlite3ErrorMsg(pParse,"out of memory");
      *p->ppIdxInfo = (sqlite3_index_info *)0x0;
      return;
    }
    lVar20 = (long)iVar26 * 0xc;
    psVar12->nConstraint = iVar26;
    psVar12->nOrderBy = uVar23;
    psVar12->aConstraint = (sqlite3_index_constraint *)(psVar12 + 1);
    psVar12->aOrderBy = (sqlite3_index_orderby *)(&psVar12[1].nConstraint + (long)iVar26 * 3);
    psVar12->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&psVar12[1].nConstraint + (long)iVar26 * 3) + (int)uVar23);
    iVar26 = 0;
    iVar15 = pWVar4->nTerm;
    if (pWVar4->nTerm < 1) {
      iVar15 = 0;
    }
    puVar11 = &pWVar4->a->eOperator;
    for (iVar24 = 0; iVar15 != iVar24; iVar24 = iVar24 + 1) {
      if (*(int *)(puVar11 + -6) == pSVar5->iCursor) {
        uVar3 = *puVar11;
        cVar25 = (char)uVar3;
        if (-1 < cVar25) {
          lVar27 = (long)iVar26 * 0xc;
          (&psVar12[1].nConstraint)[(long)iVar26 * 3] =
               ((anon_union_8_3_737c4e49_for_u *)(puVar11 + -4))->leftColumn;
          *(int *)((long)&psVar12[1].aConstraint + lVar27) = iVar24;
          if ((uVar3 & 0x7f) == 1) {
            cVar25 = '\x02';
          }
          (&psVar12[1].field_0x4)[lVar27] = cVar25;
          iVar26 = iVar26 + 1;
        }
      }
      puVar11 = puVar11 + 0x1c;
    }
    uVar17 = 0;
    uVar16 = (ulong)uVar23;
    if ((int)uVar23 < 1) {
      uVar16 = uVar17;
    }
    for (; uVar16 * 8 != uVar17; uVar17 = uVar17 + 8) {
      pEVar7 = pEVar6->a;
      *(int *)((long)&psVar12[1].nConstraint + uVar17 + lVar20) =
           (int)*(short *)(*(long *)((long)&pEVar7->pExpr + uVar17 * 4) + 0x30);
      (&psVar12[1].field_0x4)[uVar17 + lVar20] = (&pEVar7->sortOrder)[uVar17 * 4];
    }
    *p->ppIdxInfo = psVar12;
  }
  psVar18 = psVar12->aConstraint;
  uVar16 = (ulong)(uint)psVar12->nConstraint;
  local_50 = 1;
LAB_00159399:
  __s = psVar12->aConstraintUsage;
  uVar17 = 0;
  if (0 < (int)uVar16) {
    uVar17 = uVar16 & 0xffffffff;
  }
  piVar19 = &psVar18->iTermOffset;
  while (iVar15 = (int)uVar17, uVar17 = (ulong)(iVar15 - 1), iVar15 != 0) {
    if (((pWVar4->a[*piVar19].prereqRight & p->notReady) != 0) ||
       ((uVar22 = '\x01', local_50 == 0 && ((pWVar4->a[*piVar19].eOperator & 1) != 0)))) {
      uVar22 = '\0';
    }
    *(uchar *)((long)piVar19 + -3) = uVar22;
    piVar19 = piVar19 + 3;
  }
  memset(__s,0,(long)(int)uVar16 << 3);
  if (psVar12->needToFreeIdxStr != 0) {
    sqlite3_free(psVar12->idxStr);
  }
  psVar12->idxNum = 0;
  psVar12->idxStr = (char *)0x0;
  psVar12->needToFreeIdxStr = 0;
  psVar12->orderByConsumed = 0;
  psVar12->estimatedCost = 5e+98;
  uVar23 = psVar12->nOrderBy;
  if (p->pOrderBy == (ExprList *)0x0) {
    psVar12->nOrderBy = 0;
  }
  pVVar13 = sqlite3GetVTable(pParse->db,pTab);
  psVar8 = pVVar13->pVtab;
  iVar15 = (*psVar8->pModule->xBestIndex)(psVar8,psVar12);
  if (iVar15 != 0) {
    if (iVar15 == 7) {
      pParse->db->mallocFailed = '\x01';
    }
    else {
      pcVar14 = psVar8->zErrMsg;
      if (pcVar14 == (char *)0x0) {
        pcVar14 = sqlite3ErrStr(iVar15);
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar14);
    }
  }
  sqlite3_free(psVar8->zErrMsg);
  psVar8->zErrMsg = (char *)0x0;
  lVar20 = 5;
  lVar27 = 0;
  while( true ) {
    uVar10 = psVar12->nConstraint;
    uVar16 = (ulong)(int)uVar10;
    if ((long)uVar16 <= lVar27) break;
    if ((*(char *)((long)&psVar12->aConstraint->iColumn + lVar20) == '\0') &&
       (0 < psVar12->aConstraintUsage[lVar27].argvIndex)) {
      sqlite3ErrorMsg(pParse,"table %s: xBestIndex returned an invalid plan",pTab->zName);
    }
    lVar27 = lVar27 + 1;
    lVar20 = lVar20 + 0xc;
  }
  if (pParse->nErr != 0) {
    return;
  }
  uVar17 = 0;
  if (0 < (int)uVar10) {
    uVar17 = (ulong)uVar10;
  }
  psVar18 = psVar12->aConstraint;
  puVar21 = &__s->omit;
  lVar20 = 0;
  do {
    if (uVar17 * 0xc - lVar20 == 0) {
      iVar15 = psVar12->orderByConsumed;
      if (iVar15 == 0) {
        N = psVar12->estimatedCost;
        if (p->pOrderBy != (ExprList *)0x0) goto LAB_001595c3;
      }
      else {
        uVar17 = 0;
        uVar16 = (ulong)(uint)p->i;
        if (p->i < 1) {
          uVar16 = uVar17;
        }
        for (; uVar16 * 0x60 - uVar17 != 0; uVar17 = uVar17 + 0x60) {
          if ((*(byte *)((long)&(p->aLevel->plan).wsFlags + uVar17 + 3) & 2) == 0) {
            psVar12->orderByConsumed = 0;
            iVar15 = 0;
          }
        }
        N = psVar12->estimatedCost;
        if ((p->pOrderBy != (ExprList *)0x0) && (iVar15 == 0)) {
LAB_001595c3:
          dVar29 = estLog(N);
          N = N + dVar29 * N;
        }
      }
      dVar29 = 5e+98;
      if (N <= 5e+98) {
        dVar29 = N;
      }
      (p->cost).rCost = dVar29;
      (p->cost).plan.u.pVtabIdx = psVar12;
      if (psVar12->orderByConsumed == 0) {
        if ((long)p->i == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (uint)p->aLevel[(long)p->i + -1].plan.nOBSat;
        }
      }
      else {
        pbVar2 = (byte *)((long)&(p->cost).plan.wsFlags + 2);
        *pbVar2 = *pbVar2 | 0x80;
        uVar10 = uVar23;
      }
      (p->cost).plan.nOBSat = (u16)uVar10;
      (p->cost).plan.nEq = 0;
      psVar12->nOrderBy = uVar23;
      bestOrClauseIndex(p);
      return;
    }
    if ((0 < ((sqlite3_index_constraint_usage *)(puVar21 + -4))->argvIndex) &&
       (iVar15 = *(int *)((long)&psVar18->iTermOffset + lVar20), pWVar9 = pWVar4->a,
       pBVar1 = &(p->cost).used, *pBVar1 = *pBVar1 | pWVar9[iVar15].prereqRight,
       (pWVar9[iVar15].eOperator & 1) != 0)) {
      if (*puVar21 == '\0') break;
      psVar12->orderByConsumed = 0;
    }
    lVar20 = lVar20 + 0xc;
    puVar21 = puVar21 + 8;
  } while( true );
  local_50 = local_50 + -1;
  goto LAB_00159399;
}

Assistant:

static void bestVirtualIndex(WhereBestIdx *p){
  Parse *pParse = p->pParse;      /* The parsing context */
  WhereClause *pWC = p->pWC;      /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc; /* The FROM clause term to search */
  Table *pTab = pSrc->pTab;
  sqlite3_index_info *pIdxInfo;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage;
  WhereTerm *pTerm;
  int i, j;
  int nOrderBy;
  int bAllowIN;                   /* Allow IN optimizations */
  double rCost;

  /* Make sure wsFlags is initialized to some sane value. Otherwise, if the 
  ** malloc in allocateIndexInfo() fails and this function returns leaving
  ** wsFlags in an uninitialized state, the caller may behave unpredictably.
  */
  memset(&p->cost, 0, sizeof(p->cost));
  p->cost.plan.wsFlags = WHERE_VIRTUALTABLE;

  /* If the sqlite3_index_info structure has not been previously
  ** allocated and initialized, then allocate and initialize it now.
  */
  pIdxInfo = *p->ppIdxInfo;
  if( pIdxInfo==0 ){
    *p->ppIdxInfo = pIdxInfo = allocateIndexInfo(p);
  }
  if( pIdxInfo==0 ){
    return;
  }

  /* At this point, the sqlite3_index_info structure that pIdxInfo points
  ** to will have been initialized, either during the current invocation or
  ** during some prior invocation.  Now we just have to customize the
  ** details of pIdxInfo for the current invocation and pass it to
  ** xBestIndex.
  */

  /* The module name must be defined. Also, by this point there must
  ** be a pointer to an sqlite3_vtab structure. Otherwise
  ** sqlite3ViewGetColumnNames() would have picked up the error. 
  */
  assert( pTab->azModuleArg && pTab->azModuleArg[0] );
  assert( sqlite3GetVTable(pParse->db, pTab) );

  /* Try once or twice.  On the first attempt, allow IN optimizations.
  ** If an IN optimization is accepted by the virtual table xBestIndex
  ** method, but the  pInfo->aConstrainUsage.omit flag is not set, then
  ** the query will not work because it might allow duplicate rows in
  ** output.  In that case, run the xBestIndex method a second time
  ** without the IN constraints.  Usually this loop only runs once.
  ** The loop will exit using a "break" statement.
  */
  for(bAllowIN=1; 1; bAllowIN--){
    assert( bAllowIN==0 || bAllowIN==1 );

    /* Set the aConstraint[].usable fields and initialize all 
    ** output variables to zero.
    **
    ** aConstraint[].usable is true for constraints where the right-hand
    ** side contains only references to tables to the left of the current
    ** table.  In other words, if the constraint is of the form:
    **
    **           column = expr
    **
    ** and we are evaluating a join, then the constraint on column is 
    ** only valid if all tables referenced in expr occur to the left
    ** of the table containing column.
    **
    ** The aConstraints[] array contains entries for all constraints
    ** on the current table.  That way we only have to compute it once
    ** even though we might try to pick the best index multiple times.
    ** For each attempt at picking an index, the order of tables in the
    ** join might be different so we have to recompute the usable flag
    ** each time.
    */
    pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
    pUsage = pIdxInfo->aConstraintUsage;
    for(i=0; i<pIdxInfo->nConstraint; i++, pIdxCons++){
      j = pIdxCons->iTermOffset;
      pTerm = &pWC->a[j];
      if( (pTerm->prereqRight&p->notReady)==0
       && (bAllowIN || (pTerm->eOperator & WO_IN)==0)
      ){
        pIdxCons->usable = 1;
      }else{
        pIdxCons->usable = 0;
      }
    }
    memset(pUsage, 0, sizeof(pUsage[0])*pIdxInfo->nConstraint);
    if( pIdxInfo->needToFreeIdxStr ){
      sqlite3_free(pIdxInfo->idxStr);
    }
    pIdxInfo->idxStr = 0;
    pIdxInfo->idxNum = 0;
    pIdxInfo->needToFreeIdxStr = 0;
    pIdxInfo->orderByConsumed = 0;
    /* ((double)2) In case of SQLITE_OMIT_FLOATING_POINT... */
    pIdxInfo->estimatedCost = SQLITE_BIG_DBL / ((double)2);
    nOrderBy = pIdxInfo->nOrderBy;
    if( !p->pOrderBy ){
      pIdxInfo->nOrderBy = 0;
    }
  
    if( vtabBestIndex(pParse, pTab, pIdxInfo) ){
      return;
    }
  
    pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
    for(i=0; i<pIdxInfo->nConstraint; i++, pIdxCons++){
      if( pUsage[i].argvIndex>0 ){
        j = pIdxCons->iTermOffset;
        pTerm = &pWC->a[j];
        p->cost.used |= pTerm->prereqRight;
        if( (pTerm->eOperator & WO_IN)!=0 ){
          if( pUsage[i].omit==0 ){
            /* Do not attempt to use an IN constraint if the virtual table
            ** says that the equivalent EQ constraint cannot be safely omitted.
            ** If we do attempt to use such a constraint, some rows might be
            ** repeated in the output. */
            break;
          }
          /* A virtual table that is constrained by an IN clause may not
          ** consume the ORDER BY clause because (1) the order of IN terms
          ** is not necessarily related to the order of output terms and
          ** (2) Multiple outputs from a single IN value will not merge
          ** together.  */
          pIdxInfo->orderByConsumed = 0;
        }
      }
    }
    if( i>=pIdxInfo->nConstraint ) break;
  }

  /* The orderByConsumed signal is only valid if all outer loops collectively
  ** generate just a single row of output.
  */
  if( pIdxInfo->orderByConsumed ){
    for(i=0; i<p->i; i++){
      if( (p->aLevel[i].plan.wsFlags & WHERE_UNIQUE)==0 ){
        pIdxInfo->orderByConsumed = 0;
      }
    }
  }
  
  /* If there is an ORDER BY clause, and the selected virtual table index
  ** does not satisfy it, increase the cost of the scan accordingly. This
  ** matches the processing for non-virtual tables in bestBtreeIndex().
  */
  rCost = pIdxInfo->estimatedCost;
  if( p->pOrderBy && pIdxInfo->orderByConsumed==0 ){
    rCost += estLog(rCost)*rCost;
  }

  /* The cost is not allowed to be larger than SQLITE_BIG_DBL (the
  ** inital value of lowestCost in this loop. If it is, then the
  ** (cost<lowestCost) test below will never be true.
  ** 
  ** Use "(double)2" instead of "2.0" in case OMIT_FLOATING_POINT 
  ** is defined.
  */
  if( (SQLITE_BIG_DBL/((double)2))<rCost ){
    p->cost.rCost = (SQLITE_BIG_DBL/((double)2));
  }else{
    p->cost.rCost = rCost;
  }
  p->cost.plan.u.pVtabIdx = pIdxInfo;
  if( pIdxInfo->orderByConsumed ){
    p->cost.plan.wsFlags |= WHERE_ORDERED;
    p->cost.plan.nOBSat = nOrderBy;
  }else{
    p->cost.plan.nOBSat = p->i ? p->aLevel[p->i-1].plan.nOBSat : 0;
  }
  p->cost.plan.nEq = 0;
  pIdxInfo->nOrderBy = nOrderBy;

  /* Try to find a more efficient access pattern by using multiple indexes
  ** to optimize an OR expression within the WHERE clause. 
  */
  bestOrClauseIndex(p);
}